

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_ARB_window_pos(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_ARB_window_pos != 0) {
    glad_glWindowPos2dARB = (PFNGLWINDOWPOS2DARBPROC)(*load)("glWindowPos2dARB");
    glad_glWindowPos2dvARB = (PFNGLWINDOWPOS2DVARBPROC)(*load)("glWindowPos2dvARB");
    glad_glWindowPos2fARB = (PFNGLWINDOWPOS2FARBPROC)(*load)("glWindowPos2fARB");
    glad_glWindowPos2fvARB = (PFNGLWINDOWPOS2FVARBPROC)(*load)("glWindowPos2fvARB");
    glad_glWindowPos2iARB = (PFNGLWINDOWPOS2IARBPROC)(*load)("glWindowPos2iARB");
    glad_glWindowPos2ivARB = (PFNGLWINDOWPOS2IVARBPROC)(*load)("glWindowPos2ivARB");
    glad_glWindowPos2sARB = (PFNGLWINDOWPOS2SARBPROC)(*load)("glWindowPos2sARB");
    glad_glWindowPos2svARB = (PFNGLWINDOWPOS2SVARBPROC)(*load)("glWindowPos2svARB");
    glad_glWindowPos3dARB = (PFNGLWINDOWPOS3DARBPROC)(*load)("glWindowPos3dARB");
    glad_glWindowPos3dvARB = (PFNGLWINDOWPOS3DVARBPROC)(*load)("glWindowPos3dvARB");
    glad_glWindowPos3fARB = (PFNGLWINDOWPOS3FARBPROC)(*load)("glWindowPos3fARB");
    glad_glWindowPos3fvARB = (PFNGLWINDOWPOS3FVARBPROC)(*load)("glWindowPos3fvARB");
    glad_glWindowPos3iARB = (PFNGLWINDOWPOS3IARBPROC)(*load)("glWindowPos3iARB");
    glad_glWindowPos3ivARB = (PFNGLWINDOWPOS3IVARBPROC)(*load)("glWindowPos3ivARB");
    glad_glWindowPos3sARB = (PFNGLWINDOWPOS3SARBPROC)(*load)("glWindowPos3sARB");
    glad_glWindowPos3svARB = (PFNGLWINDOWPOS3SVARBPROC)(*load)("glWindowPos3svARB");
  }
  return;
}

Assistant:

static void load_GL_ARB_window_pos(GLADloadproc load) {
	if(!GLAD_GL_ARB_window_pos) return;
	glad_glWindowPos2dARB = (PFNGLWINDOWPOS2DARBPROC)load("glWindowPos2dARB");
	glad_glWindowPos2dvARB = (PFNGLWINDOWPOS2DVARBPROC)load("glWindowPos2dvARB");
	glad_glWindowPos2fARB = (PFNGLWINDOWPOS2FARBPROC)load("glWindowPos2fARB");
	glad_glWindowPos2fvARB = (PFNGLWINDOWPOS2FVARBPROC)load("glWindowPos2fvARB");
	glad_glWindowPos2iARB = (PFNGLWINDOWPOS2IARBPROC)load("glWindowPos2iARB");
	glad_glWindowPos2ivARB = (PFNGLWINDOWPOS2IVARBPROC)load("glWindowPos2ivARB");
	glad_glWindowPos2sARB = (PFNGLWINDOWPOS2SARBPROC)load("glWindowPos2sARB");
	glad_glWindowPos2svARB = (PFNGLWINDOWPOS2SVARBPROC)load("glWindowPos2svARB");
	glad_glWindowPos3dARB = (PFNGLWINDOWPOS3DARBPROC)load("glWindowPos3dARB");
	glad_glWindowPos3dvARB = (PFNGLWINDOWPOS3DVARBPROC)load("glWindowPos3dvARB");
	glad_glWindowPos3fARB = (PFNGLWINDOWPOS3FARBPROC)load("glWindowPos3fARB");
	glad_glWindowPos3fvARB = (PFNGLWINDOWPOS3FVARBPROC)load("glWindowPos3fvARB");
	glad_glWindowPos3iARB = (PFNGLWINDOWPOS3IARBPROC)load("glWindowPos3iARB");
	glad_glWindowPos3ivARB = (PFNGLWINDOWPOS3IVARBPROC)load("glWindowPos3ivARB");
	glad_glWindowPos3sARB = (PFNGLWINDOWPOS3SARBPROC)load("glWindowPos3sARB");
	glad_glWindowPos3svARB = (PFNGLWINDOWPOS3SVARBPROC)load("glWindowPos3svARB");
}